

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.hpp
# Opt level: O0

void __thiscall
cfgfile::lexical_analyzer_t<cfgfile::qstring_trait_t>::skip_multi_line_comment
          (lexical_analyzer_t<cfgfile::qstring_trait_t> *this)

{
  bool bVar1;
  char_t c1;
  char_t c1_00;
  char_t next_char;
  char_t ch;
  char16_t in_stack_ffffffffffffffe8;
  char_t in_stack_ffffffffffffffea;
  QChar in_stack_ffffffffffffffec;
  char_t in_stack_ffffffffffffffee;
  QChar local_c;
  
  bVar1 = input_stream_t<cfgfile::qstring_trait_t>::at_end
                    ((input_stream_t<cfgfile::qstring_trait_t> *)
                     CONCAT26(in_stack_ffffffffffffffee.ucs,
                              CONCAT24(in_stack_ffffffffffffffec.ucs,
                                       CONCAT22(in_stack_ffffffffffffffea.ucs,
                                                in_stack_ffffffffffffffe8))));
  if (!bVar1) {
    c1 = input_stream_t<cfgfile::qstring_trait_t>::get
                   ((input_stream_t<cfgfile::qstring_trait_t> *)
                    CONCAT26(in_stack_ffffffffffffffee.ucs,
                             CONCAT24(in_stack_ffffffffffffffec.ucs,
                                      CONCAT22(in_stack_ffffffffffffffea.ucs,
                                               in_stack_ffffffffffffffe8))));
    bVar1 = input_stream_t<cfgfile::qstring_trait_t>::at_end
                      ((input_stream_t<cfgfile::qstring_trait_t> *)
                       CONCAT26(in_stack_ffffffffffffffee.ucs,
                                CONCAT24(in_stack_ffffffffffffffec.ucs,
                                         CONCAT22(in_stack_ffffffffffffffea.ucs,
                                                  in_stack_ffffffffffffffe8))));
    if (!bVar1) {
      c1_00 = input_stream_t<cfgfile::qstring_trait_t>::get
                        ((input_stream_t<cfgfile::qstring_trait_t> *)
                         CONCAT26(in_stack_ffffffffffffffee.ucs,
                                  CONCAT24(in_stack_ffffffffffffffec.ucs,
                                           CONCAT22(in_stack_ffffffffffffffea.ucs,
                                                    in_stack_ffffffffffffffe8))));
      bVar1 = ::operator==((QChar)c1.ucs,const_t<cfgfile::qstring_trait_t>::c_sharp);
      if (!bVar1) goto LAB_00139577;
      in_stack_ffffffffffffffec.ucs = const_t<cfgfile::qstring_trait_t>::c_vertical_bar.ucs;
      in_stack_ffffffffffffffee = c1_00;
      bVar1 = ::operator==((QChar)c1_00.ucs,const_t<cfgfile::qstring_trait_t>::c_vertical_bar);
      while (!bVar1) {
LAB_00139577:
        do {
          local_c.ucs = c1_00.ucs;
          bVar1 = input_stream_t<cfgfile::qstring_trait_t>::at_end
                            ((input_stream_t<cfgfile::qstring_trait_t> *)
                             CONCAT26(in_stack_ffffffffffffffee.ucs,
                                      CONCAT24(in_stack_ffffffffffffffec.ucs,
                                               CONCAT22(in_stack_ffffffffffffffea.ucs,
                                                        in_stack_ffffffffffffffe8))));
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            return;
          }
          c1_00 = input_stream_t<cfgfile::qstring_trait_t>::get
                            ((input_stream_t<cfgfile::qstring_trait_t> *)
                             CONCAT26(in_stack_ffffffffffffffee.ucs,
                                      CONCAT24(in_stack_ffffffffffffffec.ucs,
                                               CONCAT22(in_stack_ffffffffffffffea.ucs,
                                                        in_stack_ffffffffffffffe8))));
          in_stack_ffffffffffffffea = c1_00;
          bVar1 = ::operator==(local_c,const_t<cfgfile::qstring_trait_t>::c_sharp);
          in_stack_ffffffffffffffe8 = local_c.ucs;
        } while (!bVar1);
        bVar1 = ::operator==((QChar)c1_00.ucs,const_t<cfgfile::qstring_trait_t>::c_vertical_bar);
        in_stack_ffffffffffffffe8 = local_c.ucs;
      }
    }
  }
  return;
}

Assistant:

void skip_multi_line_comment()
	{
		if( !m_stream.at_end() )
		{
			typename Trait::char_t ch = m_stream.get();

			if( m_stream.at_end() )
				return;

			typename Trait::char_t next_char = m_stream.get();

			if( ch == const_t< Trait >::c_sharp &&
				next_char == const_t< Trait >::c_vertical_bar )
					return;

			while( !m_stream.at_end() )
			{
				ch = next_char;

				next_char = m_stream.get();

				if( ch == const_t< Trait >::c_sharp &&
					next_char == const_t< Trait >::c_vertical_bar )
						break;
			}
		}
	}